

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

int __thiscall TadsHttpServerThread::process_request(TadsHttpServerThread *this)

{
  OS_Counter *pOVar1;
  ulong uVar2;
  OS_Event *pOVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  StringRef *dst;
  char *pcVar8;
  void *pvVar9;
  void *pvVar10;
  TadsHttpRequest *this_00;
  ssize_t sVar11;
  StringRef *this_01;
  long lVar12;
  ulong uVar13;
  size_t __n;
  long lVar14;
  TadsHttpRequestHeader *h_1;
  TadsHttpRequestHeader *pTVar15;
  char *pcVar16;
  StringRef *pSVar17;
  size_t msg_len;
  int iVar18;
  TadsHttpRequestHeader *h;
  long lVar19;
  OS_Counter *pOVar20;
  long lVar21;
  TadsHttpRequestHeader *hdr_list;
  char *local_68;
  TadsHttpRequestHeader *hdr_tail;
  size_t res_name_len;
  char *resource_name;
  size_t verb_len;
  char *verb;
  char *p;
  
  dst = (StringRef *)operator_new(0x28);
  (dst->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (dst->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__StringRef_003526c8;
  dst->alo = 0x400;
  pcVar8 = (char *)malloc(0x401);
  dst->str = pcVar8;
  *pcVar8 = '\0';
  this_01 = (StringRef *)0x0;
  dst->len = 0;
  hdr_list = (TadsHttpRequestHeader *)0x0;
  hdr_tail = (TadsHttpRequestHeader *)0x0;
  uVar5 = read_to_nl(this,dst,0,0,4);
  iVar6 = 0;
  if ((int)uVar5 < 0) goto LAB_0020cf6d;
  uVar13 = (ulong)uVar5;
  local_68 = dst->str;
  uVar2 = dst->len;
  lVar19 = uVar13 - 2;
  if (lVar19 < (long)uVar2) {
    dst->len = lVar19;
    local_68[lVar19] = '\0';
  }
  local_68 = local_68 + uVar13;
  pvVar9 = (void *)(uVar2 - uVar13);
  p = dst->str;
  parse_tok(&p,&verb,&verb_len);
  parse_tok(&p,&resource_name,&res_name_len);
  pcVar8 = (char *)0x0;
  TadsHttpRequestHeader::parse_headers(&hdr_list,&hdr_tail,0,dst,0);
  pTVar15 = hdr_list;
  do {
    iVar6 = stricmp(pTVar15->name,"content-length");
    if (iVar6 == 0) {
      pcVar8 = pTVar15->value;
      break;
    }
    pTVar15 = pTVar15->nxt;
  } while (pTVar15 != (TadsHttpRequestHeader *)0x0);
  pcVar16 = (char *)0x0;
  pTVar15 = hdr_list;
  do {
    iVar6 = stricmp(pTVar15->name,"transfer-encoding");
    if (iVar6 == 0) {
      pcVar16 = pTVar15->value;
      break;
    }
    pTVar15 = pTVar15->nxt;
  } while (pTVar15 != (TadsHttpRequestHeader *)0x0);
  if (pcVar8 == (char *)0x0 && pcVar16 == (char *)0x0) {
    uVar5 = 0;
    this_01 = (StringRef *)0x0;
  }
  else {
    if (pcVar8 == (char *)0x0) {
      iVar6 = stricmp(pcVar16,"chunked");
      if (iVar6 == 0) {
        this_01 = (StringRef *)operator_new(0x28);
        pvVar10 = (void *)0x7d00;
        if (32000 < (long)pvVar9) {
          pvVar10 = pvVar9;
        }
        (this_01->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
        (this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__StringRef_003526c8;
        this_01->alo = (long)pvVar10;
        pcVar8 = (char *)malloc((long)pvVar10 + 1);
        this_01->str = pcVar8;
        *pcVar8 = '\0';
        this_01->len = 0;
        if (uVar2 != uVar13) {
          StringRef::append(this_01,local_68,(long)pvVar9);
        }
        uVar5 = 0;
        lVar19 = 0;
        do {
          iVar18 = 2;
          iVar6 = read_to_nl(this,this_01,lVar19,0,2);
          if (-1 < iVar6) {
            lVar21 = (long)iVar6;
            lVar12 = strtol(this_01->str + lVar19,(char **)0x0,0x10);
            __n = this_01->len - lVar21;
            if (__n != 0 && lVar21 <= this_01->len) {
              memmove(this_01->str + lVar19,this_01->str + lVar21,__n);
            }
            lVar21 = __n + lVar19;
            if (lVar21 < this_01->len) {
              this_01->len = lVar21;
              this_01->str[lVar21] = '\0';
            }
            iVar18 = 2;
            if (lVar12 == 0) {
              iVar18 = 4;
            }
            else {
              if ((this->upload_limit != 0) && (uVar5 == 0)) {
                uVar5 = (uint)(this->upload_limit < this_01->len + lVar12);
              }
              lVar21 = lVar12 - __n;
              if (lVar21 < -1) {
                lVar21 = __n - lVar12;
                if (lVar21 < 2) {
                  pvVar9 = (void *)(2 - lVar21);
                  StringRef::ensure(this_01,(long)pvVar9);
                  sVar11 = TadsServerThread::read
                                     (&this->super_TadsServerThread,
                                      (int)this_01->str + (int)this_01->len,pvVar9,(size_t)pvVar9);
                  if (sVar11 < 0) {
                    send_simple(this,"400 Bad Request","text/html",
                                "Error receiving request message chunk",0x25,(char *)0x0);
                    iVar18 = 2;
                    goto LAB_0020cdd5;
                  }
                }
                lVar19 = lVar19 + lVar12;
                if (2 < lVar21) {
                  memmove(this_01->str + lVar19,this_01->str + lVar19 + 2,lVar21 - 2);
                  lVar12 = this_01->len;
                  this_01->len = lVar12 + -2;
                  this_01->str[lVar12 + -2] = '\0';
                }
                iVar18 = 0;
              }
              else {
                pvVar9 = (void *)(lVar21 + 2);
                if (uVar5 == 0) {
                  StringRef::ensure(this_01,(long)pvVar9);
                  sVar11 = TadsServerThread::read
                                     (&this->super_TadsServerThread,
                                      (int)this_01->str + (int)this_01->len,pvVar9,(size_t)pvVar9);
                  if (sVar11 < 0) {
                    send_simple(this,"400 Bad Request","text/html",
                                "Error receiving request message chunk");
                  }
                  else {
                    lVar12 = this_01->len;
                    lVar14 = (long)pvVar9 + lVar12;
                    this_01->len = lVar14;
                    if (*(short *)(this_01->str + lVar14 + -2) == 0xa0d) {
                      lVar19 = lVar12 + lVar21;
                      this_01->len = lVar19;
                      this_01->str[lVar19] = '\0';
                      iVar18 = 0;
                    }
                    else {
                      send_simple(this,"400 Bad Request","text/html",
                                  "Error in request message chunk",0x1e,(char *)0x0);
                    }
                  }
                }
                else {
                  sVar11 = TadsServerThread::read
                                     (&this->super_TadsServerThread,0,(void *)0x0,(size_t)pvVar9);
                  if (-1 < sVar11) {
                    if (0 < this_01->len) {
                      this_01->len = 0;
                      *this_01->str = '\0';
                    }
                    iVar18 = 0;
                    lVar19 = 0;
                  }
                }
              }
            }
          }
LAB_0020cdd5:
        } while (iVar18 == 0);
        if ((iVar18 == 4) && (uVar7 = read_to_nl(this,this_01,lVar19,2,4), -1 < (int)uVar7)) {
          if (lVar19 + 2 < (long)(ulong)uVar7) {
            TadsHttpRequestHeader::parse_headers(&hdr_list,&hdr_tail,1,this_01,lVar19);
          }
          if (lVar19 < this_01->len) {
            this_01->len = lVar19;
            this_01->str[lVar19] = '\0';
          }
          goto LAB_0020cb78;
        }
      }
      else {
        this_01 = (StringRef *)0x0;
        send_simple(this,"400 Bad Request","text/html",
                    "<html><title>Bad Request</title><h1>Bad Request</h1>This server does not accept the specified transfer-encoding."
                    ,0x70,(char *)0x0);
      }
      iVar6 = 0;
      goto LAB_0020cf6d;
    }
    pvVar10 = (void *)atol(pcVar8);
    iVar6 = 0;
    if (pvVar10 == (void *)0x0) {
      this_01 = (StringRef *)0x0;
LAB_0020cb69:
      uVar5 = 0;
      bVar4 = false;
    }
    else if ((this->upload_limit == 0) || ((long)pvVar10 <= this->upload_limit)) {
      this_01 = (StringRef *)operator_new(0x28);
      (this_01->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
      (this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__StringRef_003526c8;
      this_01->alo = (long)pvVar10;
      pcVar8 = (char *)malloc((long)pvVar10 + 1);
      this_01->str = pcVar8;
      *pcVar8 = '\0';
      this_01->len = 0;
      if (uVar2 != uVar13) {
        if ((long)pvVar10 <= (long)pvVar9) {
          pvVar9 = pvVar10;
        }
        StringRef::append(this_01,local_68,(long)pvVar9);
        pvVar10 = (void *)((long)pvVar10 - (long)pvVar9);
      }
      if ((pvVar10 == (void *)0x0) ||
         (sVar11 = TadsServerThread::read
                             (&this->super_TadsServerThread,(int)this_01->str + (int)this_01->len,
                              pvVar10,(size_t)pvVar10), -1 < sVar11)) {
        this_01->len = this_01->len + (long)pvVar10;
        goto LAB_0020cb69;
      }
      send_simple(this,"400 Bad Request","text/html","Error receiving request message body");
      bVar4 = true;
      uVar5 = 0;
    }
    else {
      this_01 = (StringRef *)0x0;
      TadsServerThread::read(&this->super_TadsServerThread,0,(void *)0x0,(size_t)pvVar10);
      uVar5 = 1;
      bVar4 = false;
    }
    if (bVar4) goto LAB_0020cf6d;
LAB_0020cb78:
    if (this_01 != (StringRef *)0x0 && uVar5 != 0) {
      LOCK();
      pOVar20 = &(this_01->super_CVmRefCntObj).cnt;
      (pOVar20->cnt).super___atomic_base<long>._M_i =
           (pOVar20->cnt).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      uVar5 = 1;
      if ((pOVar20->cnt).super___atomic_base<long>._M_i == 0) {
        (*(this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_01);
      }
      this_01 = (StringRef *)0x0;
    }
  }
  this_00 = (TadsHttpRequest *)operator_new(0x70);
  pSVar17 = dst;
  TadsHttpRequest::TadsHttpRequest
            (this_00,this,verb,verb_len,dst,hdr_list,this_01,uVar5,resource_name,res_name_len,
             ((this->super_TadsServerThread).listener)->shutdown_evt);
  hdr_list = (TadsHttpRequestHeader *)0x0;
  sVar11 = TadsMessageQueue::send
                     (this->queue,(int)this_00,(void *)0xffffffffffffffff,verb_len,(int)pSVar17);
  if ((int)sVar11 == 0) {
    pOVar3 = this->queue->quit_evt;
    if ((pOVar3 == (OS_Event *)0x0) ||
       (iVar6 = OS_Waitable::test(&pOVar3->super_OS_Waitable), iVar6 == 0)) {
      pcVar16 = "500 Internal Server Error";
      pcVar8 = 
      "<html><title>500 Internal Server Error</title><body><h1>Internal Server Error</h1></body></html>"
      ;
      msg_len = 0x60;
    }
    else {
      pcVar16 = "503 Service Unavailable (Shutting Down)";
      pcVar8 = 
      "<html><title>503 Service Unavailable</title><body><h1>Service Unavailable</h1>The server is shutting down and cannot process any more requests.</body></html>"
      ;
      msg_len = 0x9d;
    }
    send_simple(this,pcVar16,"text/html",pcVar8,msg_len,(char *)0x0);
  }
  LOCK();
  pOVar20 = &(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.cnt;
  (pOVar20->cnt).super___atomic_base<long>._M_i = (pOVar20->cnt).super___atomic_base<long>._M_i + -1
  ;
  UNLOCK();
  iVar6 = 1;
  if ((pOVar20->cnt).super___atomic_base<long>._M_i == 0) {
    (*(this_00->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj[1])
              (this_00);
  }
LAB_0020cf6d:
  pOVar20 = &(dst->super_CVmRefCntObj).cnt;
  if (this_01 != (StringRef *)0x0) {
    LOCK();
    pOVar1 = &(this_01->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(this_01->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_01);
    }
  }
  LOCK();
  (pOVar20->cnt).super___atomic_base<long>._M_i = (pOVar20->cnt).super___atomic_base<long>._M_i + -1
  ;
  UNLOCK();
  if ((pOVar20->cnt).super___atomic_base<long>._M_i == 0) {
    (*(dst->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(dst);
  }
  pTVar15 = hdr_list;
  if (hdr_list != (TadsHttpRequestHeader *)0x0) {
    TadsHttpRequestHeader::~TadsHttpRequestHeader(hdr_list);
    operator_delete(pTVar15,0x18);
  }
  return iVar6;
}

Assistant:

int TadsHttpServerThread::process_request()
{
    StringRef *hdrs = new StringRef(1024);
    TadsHttpRequestHeader *hdr_list = 0, *hdr_tail = 0;
    TadsHttpRequest *req = 0;
    char *verb;
    size_t verb_len;
    char *resource_name;
    size_t res_name_len;
    int ok = FALSE;
    long ofs;
    char *p, *hbody;
    StringRef *body = 0;
    int overflow = FALSE;
    long hbodylen;
    const char *hcl, *hte;             /* content-length, transfer-encoding */

    /* 
     *   Read the header.  We read data into our buffer until we find a
     *   double CR-LF sequence, indicating the end of the header.  
     */
    if ((ofs = read_to_nl(hdrs, 0, 0, 4)) < 0)
        goto done;

    /* the body, if any, starts after the double line break */
    hbody = hdrs->get() + ofs;
    hbodylen = hdrs->getlen() - ofs;

    /* truncate the headers to the CR-LF-CR-LF sequence */
    hdrs->truncate(ofs - 2);

    /*
     *   Parse the main verb in the header - get the method and the resource
     *   ID.  The format is:
     *   
     *.     <space>* VERB <space>+ RESOURCE <space>+ HTTP-VERSION <CRLF>
     */
    p = hdrs->get();
    parse_tok(p, verb, verb_len);
    parse_tok(p, resource_name, res_name_len);

    /* now parse the remaining headers */
    TadsHttpRequestHeader::parse_headers(hdr_list, hdr_tail, FALSE, hdrs, 0);

    /* 
     *   Check to see if there's a message body.  There is if there's a
     *   content-length or transfer-encoding header.
     */
    hcl = hdr_list->find("content-length");
    hte = hdr_list->find("transfer-encoding");
    if (hcl != 0 || hte != 0)
    {
        /* 
         *   There's a content body.  If there's a content-length field,
         *   pre-allocate a chunk of memory, then read the number of bytes
         *   indicated.  If it's a chunked transfer, read it in pieces.  
         */
        if (hcl != 0)
        {
            /* get the length */
            long hclval = atol(hcl);

            /* if it's non-zero, read the content */
            if (hclval != 0)
            {
                /* if this exceeds the size limit, abort */
                if (upload_limit != 0 && hclval > upload_limit)
                {
                    /* set the overflow flag, discard the input, and abort */
                    overflow = TRUE;
                    read(0, 0, hclval, 5000);
                    goto done_with_upload;
                }

                /* allocate the buffer; it's initially empty */
                body = new StringRef(hclval);

                /* copy any portion of the body we've already read */
                if (hbodylen != 0)
                {
                    /* limit this to the declared size */
                    if (hbodylen > hclval)
                        hbodylen = hclval;

                    /* copy the data */
                    body->append(hbody, hbodylen);

                    /* deduct the remaining size */
                    hclval -= hbodylen;
                }

                /* read the body */
                if (hclval != 0
                    && read(body->getend(), hclval, hclval, 5000) < 0)
                {
                    send_simple(S_http_400, "text/html",
                                "Error receiving request message body");
                    goto done;
                }

                /* set the body length */
                body->addlen(hclval);
            }
        }
        else if (stricmp(hte, "chunked") == 0)
        {
            /* set up a string buffer for the content */
            const long initlen = 32000;
            body = new StringRef(hbodylen > initlen ? hbodylen : initlen);

            /* if we've already read some body text, copy it to the buffer */
            if (hbodylen != 0)
                body->append(hbody, hbodylen);
            
            /* keep going until we reach the end marker */
            for (ofs = 0 ; ; )
            {
                /* read to the first newline */
                long nlofs = read_to_nl(body, ofs, 0, 2);
                if (nlofs < 0)
                    goto done;

                /* get the chunk length */
                long chunklen = strtol(body->get() + ofs, 0, 16);

                /* 
                 *   We're done with the chunk length.  Move any read-ahead
                 *   content down in memory so that it directly abuts the
                 *   preceding chunk, so that when we're done we'll have the
                 *   content assembled into one contiguous piece.  
                 */
                long ralen = body->getlen() - nlofs;
                if (ralen > 0)
                    memmove(body->get() + ofs, body->get() + nlofs,
                            body->getlen() - nlofs);

                /* stop at the end of the read-ahead portion */
                body->truncate(ofs + ralen);

                /* if the chunk length is zero, we're done */
                if (chunklen == 0)
                    break;

                /* check if this would overflow our upload size limit */
                if (upload_limit != 0
                    && !overflow
                    && body->getlen() + chunklen > upload_limit)
                {
                    /* flag the overflow, but keep reading the content */
                    overflow = TRUE;
                }

                /* 
                 *   figure the remaining read size for this chunk, after any
                 *   read-ahead portion 
                 */
                long chunkrem = chunklen - ralen;

                /* 
                 *   if we've already overflowed, read and discard the chunk;
                 *   otherwise read it into our buffer 
                 */
                if (chunkrem + 2 <= 0)
                {
                    /* 
                     *   We've already read ahead by enough to cover the next
                     *   chunk and the newline at the end.  Go in and delete
                     *   the newline (or as much of it as exists).  Start by
                     *   getting the offset of the newline: it's just after
                     *   the current chunk, which starts at 'ofs' and runs
                     *   for 'chunklen'.  
                     */
                    nlofs = ofs + chunklen;

                    /* 
                     *   if we haven't yet read the full newline sequence, do
                     *   so now
                     */
                    if (ralen - chunklen < 2)
                    {
                        long nllen = 2 - (ralen - chunklen);
                        body->ensure(nllen);
                        if (read(body->getend(), nllen, nllen, 30000) < 0)
                        {
                            send_simple(S_http_400, "text/html",
                                        "Error receiving request message chunk");
                            goto done;
                        }
                    }

                    /* 
                     *   if there's anything after the newline, move it down
                     *   to overwrite the newline 
                     */
                    if (ralen - chunklen > 2)
                    {
                        /* move the bytes */
                        memmove(body->get() + nlofs,
                                body->get() + nlofs + 2,
                                ralen - chunklen - 2);

                        /* adjust the size for the closed gap */
                        body->truncate(body->getlen() - 2);
                    }

                    /* resume from after the newline */
                    ofs = nlofs;
                }
                else if (overflow)
                {
                    /* overflow - discard the chunk size (plus the CR-LF) */
                    if (read(0, 0, chunkrem+2, 30000) < 0)
                        goto done;

                    /* clear the buffer */
                    body->truncate(0);
                    ofs = 0;
                }
                else
                {
                    /* ensure the buffer is big enough */
                    body->ensure(chunkrem + 2);

                    /* read the chunk, plus the CR-LF that follows */
                    if (read(body->getend(),
                             chunkrem + 2, chunkrem + 2, 30000) < 0)
                    {
                        send_simple(S_http_400, "text/html",
                                    "Error receiving request message chunk");
                        goto done;
                    }

                    /* count the amount we just read in the buffer length */
                    body->addlen(chunkrem + 2);

                    /* verify that the last two bytes are indeed CR-LF */
                    if (memcmp(body->getend() - 2, "\r\n", 2) != 0)
                    {
                        send_simple(S_http_400, "text/html",
                                    "Error in request message chunk");
                        goto done;
                    }

                    /* 
                     *   move past the chunk for the next read, minus the
                     *   CR-LF that follows the chunk - that isn't part of
                     *   the data, but just part of the protocol 
                     */
                    ofs = body->getlen() - 2;
                    body->truncate(ofs);
                }
            }

            /* 
             *   Read to the closing blank line.  We've just passed one
             *   newline, following the '0' end length marker, so we're in
             *   state 2.  We could have either another newline following, or
             *   "trailers" (more headers, following the content body).
             */
            long nlofs = read_to_nl(body, ofs, 2, 4);
            if (nlofs < 0)
                goto done;

            /* 
             *   if we have more than just the closing blank line, we have
             *   trailers - append them to the headers 
             */
            if (nlofs > ofs + 2)
            {
                TadsHttpRequestHeader::parse_headers(
                    hdr_list, hdr_tail, TRUE, body, ofs);
            }

            /* 
             *   the trailers (if any) and closing newline aren't part of the
             *   content - clip them out of the body 
             */
            body->truncate(ofs);
        }
        else
        {
            /* 
             *   Other combinations of these headers are illegal.  Send an
             *   error and abort. 
             */
            send_simple(S_http_400, "text/html",
                        "<html><title>Bad Request</title>"
                        "<h1>Bad Request</h1>"
                        "This server does not accept the specified "
                        "transfer-encoding.");
            goto done;
        }

    done_with_upload:
        /* done with the upload - check for overflow */
        if (overflow)
        {
            /* release the body, if present */
            if (body != 0)
            {
                body->release_ref();
                body = 0;
            }
        }
    }

    /* create a message object for the request */
    req = new TadsHttpRequest(
        this, verb, verb_len, hdrs, hdr_list, body, overflow,
        resource_name, res_name_len,
        listener->get_shutdown_evt());

    /* we've handed over the header list to the request */
    hdr_list = 0;
    
    /* send it to the main thread, and wait for the reply */
    if (queue->send(req, OS_FOREVER))
    {
        /* 
         *   success - the server will already have sent the reply, so we're
         *   done 
         */
    }
    else if (queue->is_quitting())
    {
        /* failed due to server shutdown */
        send_simple(S_http_503, "text/html", S_http_503_quitting_body);
    }
    else
    {
        /* 'send' failed - return an internal server error */
        send_simple(S_http_500, "text/html", S_http_500_body);
    }
    
    /* we're done with the request */
    req->release_ref();

    /* success */
    ok = TRUE;

done:
    /* release the message body buffer */
    if (body != 0)
        body->release_ref();

    /* release the header buffer */
    hdrs->release_ref();

    /* delete the header list */
    if (hdr_list != 0)
        delete hdr_list;

    /* return the success/failure indication */
    return ok;
}